

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avltree.cc
# Opt level: O1

avl_node * avl_insert(avl_tree *tree,avl_node *node,avl_cmp_func *func)

{
  avl_node *paVar1;
  uint uVar2;
  int iVar3;
  avl_tree *paVar4;
  avl_node *paVar5;
  avl_node *paVar6;
  uint uVar7;
  long lVar8;
  avl_node *paVar9;
  uint uVar10;
  
  paVar6 = tree->root;
  if (tree->root == (avl_node *)0x0) {
    paVar9 = (avl_node *)0x0;
  }
  else {
    do {
      paVar9 = paVar6;
      iVar3 = (*func)(paVar9,node,tree->aux);
      lVar8 = 8;
      if ((iVar3 < 1) && (lVar8 = 0x10, -1 < iVar3)) {
        return paVar9;
      }
      paVar6 = *(avl_node **)((long)&paVar9->parent + lVar8);
    } while (paVar6 != (avl_node *)0x0);
  }
  node->parent = (avl_node *)(((ulong)paVar9 & 0xfffffffffffffffc) + 1);
  node->left = (avl_node *)0x0;
  node->right = (avl_node *)0x0;
  paVar4 = tree;
  if (paVar9 != (avl_node *)0x0) {
    iVar3 = (*func)(paVar9,node,tree->aux);
    if (iVar3 < 1) {
      paVar4 = (avl_tree *)&paVar9->right;
    }
    else {
      paVar4 = (avl_tree *)&paVar9->left;
    }
  }
  paVar4->root = node;
  iVar3 = 0;
  do {
    if (node == (avl_node *)0x0) {
      return (avl_node *)0x0;
    }
    paVar6 = node->parent;
    paVar9 = (avl_node *)((ulong)paVar6 & 0xfffffffffffffffc);
    if (paVar9 == (avl_node *)0x0) {
      paVar5 = node;
      if (node == tree->root) {
        paVar6 = _balance_tree(tree->root,iVar3);
        tree->root = paVar6;
        return node;
      }
    }
    else {
      paVar1 = paVar9->right;
      paVar5 = _balance_tree(node,iVar3);
      (&paVar9->left)[paVar1 == node] = paVar5;
      if ((paVar5->left != (avl_node *)0x0) || (paVar5->right != (avl_node *)0x0)) {
        uVar10 = ((uint)paVar6 & 3) - 1;
        uVar2 = -uVar10;
        if (0 < (int)uVar10) {
          uVar2 = uVar10;
        }
        uVar7 = (*(uint *)&paVar5->parent & 3) - 1;
        uVar10 = -uVar7;
        if (0 < (int)uVar7) {
          uVar10 = uVar7;
        }
        iVar3 = 0;
        if (uVar10 <= uVar2) goto LAB_00105f13;
      }
      iVar3 = (uint)(paVar9->left != paVar5) * 2 + -1;
    }
LAB_00105f13:
    node = paVar9;
    if (iVar3 == 0) {
      return paVar5;
    }
  } while( true );
}

Assistant:

struct avl_node* avl_insert(struct avl_tree *tree,
                            struct avl_node *node,
                            avl_cmp_func *func)
{
    __AVL_DEBUG_INSERT(node);

    struct avl_node *p=NULL,*cur;
    int cmp, bf, bf_old;

    cur = tree->root;
    while(cur)
    {
        cmp = func(cur, node, tree->aux);
        p = cur;

        if(cmp > 0) {
            cur = cur->left;
        }else if (cmp < 0){
            cur = cur->right;
        }else {
            // duplicated key -> return
            return cur;
        }
    }

    avl_set_parent(node, p);
    avl_set_bf(node, 0);
    node->left = node->right = NULL;
#ifdef _AVL_NEXT_POINTER
    node->prev = node->next = NULL;
#endif

    // P is parent node of CUR
    if(p) {
        if(func(p, node, tree->aux) > 0) {
            p->left = node;
#ifdef _AVL_NEXT_POINTER
            node->next = p;
            node->prev = p->prev;
            if (p->prev) p->prev->next = node;
            p->prev = node;
#endif

        }else {
            p->right = node;
#ifdef _AVL_NEXT_POINTER
            node->prev = p;
            node->next = p->next;
            if (p->next) p->next->prev = node;
            p->next = node;
#endif
        }

    } else {
        // no parent .. make NODE as root
        tree->root = node;
    }

    // recursive balancing process .. scan from leaf to root
    bf = 0;
    while(node) {
        p = avl_parent(node);

        if (p) {
            // if parent exists
            bf_old = avl_bf(node);

            if (p->right == node) {
                node = _balance_tree(node, bf);
                p->right = node;
            }else {
                node = _balance_tree(node, bf);
                p->left = node;
            }

            // calculate balance facter BF for parent
            if (node->left == NULL && node->right == NULL) {
                // leaf node
                if (p->left == node) bf = -1;
                else bf = 1;
            } else {
                // index ndoe
                bf = 0;
                if (_abs(bf_old) < _abs(avl_bf(node))) {
                    // if ABS of balance factor increases
                    // cascade to parent
                    if (p->left == node) bf = -1;
                    else bf = 1;
                }
            }

        } else if(node == tree->root){
            tree->root = _balance_tree(tree->root, bf);
            break;
        }
        if (bf == 0) break;

        node = p;
    }

    __AVL_DEBUG_DISPLAY(tree);

    return node;
}